

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O0

void deqp::egl::logSurfaceAttribute(TestLog *log,EGLint attribute,EGLint value)

{
  MessageBuilder *pMVar1;
  MessageBuilder local_1a8;
  SurfaceAttribValueFmt local_28;
  SurfaceAttribValueFmt valueFmt;
  char *name;
  EGLint value_local;
  EGLint attribute_local;
  TestLog *log_local;
  
  valueFmt = (SurfaceAttribValueFmt)eglu::getSurfaceAttribName(attribute);
  eglu::SurfaceAttribValueFmt::SurfaceAttribValueFmt(&local_28,attribute,value);
  tcu::TestLog::operator<<(&local_1a8,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [3])0x29ded70);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char **)&valueFmt);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a18ff4);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_28);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  return;
}

Assistant:

static void logSurfaceAttribute (tcu::TestLog& log, EGLint attribute, EGLint value)
{
	const char*								name		= eglu::getSurfaceAttribName(attribute);
	const eglu::SurfaceAttribValueFmt		valueFmt	(attribute, value);

	log << TestLog::Message << "  " << name << ": " << valueFmt << TestLog::EndMessage;
}